

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator
          (NetworkSelectionComparator *this)

{
  element_type *this_00;
  char *local_b8;
  allocator local_99;
  string local_98;
  Status local_71;
  undefined1 local_70 [7];
  RegistryStatus status;
  Network nwk;
  NetworkSelectionComparator *this_local;
  
  if ((this->mSuccess & 1U) != 0) {
    nwk._88_8_ = this;
    persistent_storage::Network::Network((Network *)local_70);
    this_00 = std::
              __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->mInterpreter->mRegistry);
    local_71 = persistent_storage::Registry::GetCurrentNetwork(this_00,(Network *)local_70);
    if ((local_71 == kSuccess) && (this->mStartWith != nwk.mName.field_2._8_8_)) {
      if (nwk.mName.field_2._8_8_ == 0) {
        local_b8 = "Network selection was dropped by the command";
      }
      else {
        local_b8 = "Network selection was changed by the command";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_98,local_b8,&local_99);
      Console::Write(&local_98,kYellow);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    persistent_storage::Network::~Network((Network *)local_70);
  }
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator()
{
    if (mSuccess)
    {
        Network        nwk;
        RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

        if (status == RegistryStatus::kSuccess && mStartWith != nwk.mXpan)
        {
            Console::Write(nwk.mXpan == 0 ? WARN_NETWORK_SELECTION_DROPPED : WARN_NETWORK_SELECTION_CHANGED,
                           Console::Color::kYellow);
        }
    }
}